

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O2

void genxDispose(genxWriter w)

{
  void **ppvVar1;
  void **ppvVar2;
  void **ppvVar3;
  void **ppvVar4;
  long lVar5;
  
  ppvVar1 = (w->namespaces).pointers;
  ppvVar2 = (w->elements).pointers;
  ppvVar3 = (w->attributes).pointers;
  ppvVar4 = (w->prefixes).pointers;
  for (lVar5 = 0; lVar5 < (w->namespaces).count; lVar5 = lVar5 + 1) {
    deallocate(w,*(void **)((long)ppvVar1[lVar5] + 8));
    deallocate(w,ppvVar1[lVar5]);
  }
  for (lVar5 = 0; lVar5 < (w->elements).count; lVar5 = lVar5 + 1) {
    deallocate(w,*(void **)((long)ppvVar2[lVar5] + 8));
    deallocate(w,ppvVar2[lVar5]);
  }
  for (lVar5 = 0; lVar5 < (w->attributes).count; lVar5 = lVar5 + 1) {
    deallocate(w,*(void **)((long)ppvVar3[lVar5] + 8));
    deallocate(w,*(void **)((long)ppvVar3[lVar5] + 0x18));
    deallocate(w,ppvVar3[lVar5]);
  }
  for (lVar5 = 0; lVar5 < (w->prefixes).count; lVar5 = lVar5 + 1) {
    deallocate(w,ppvVar4[lVar5]);
  }
  deallocate(w,(w->namespaces).pointers);
  deallocate(w,(w->elements).pointers);
  deallocate(w,(w->attributes).pointers);
  deallocate(w,(w->prefixes).pointers);
  deallocate(w,(w->stack).pointers);
  deallocate(w,(w->arec).value.buf);
  deallocate(w,w->empty);
  deallocate(w,w);
  return;
}

Assistant:

void genxDispose(genxWriter w)
{
  int i;
  genxNamespace * nn = (genxNamespace *) w->namespaces.pointers;
  genxElement * ee = (genxElement *) w->elements.pointers;
  genxAttribute * aa = (genxAttribute *) w->attributes.pointers;
  utf8 * pp = (utf8 *) w->prefixes.pointers;

  for (i = 0; i < w->namespaces.count; i++)
  {
    deallocate(w, nn[i]->name);
    deallocate(w, nn[i]);
  }

  for (i = 0; i < w->elements.count; i++)
  {
    deallocate(w, ee[i]->type);
    deallocate(w, ee[i]);
  }

  for (i = 0; i < w->attributes.count; i++)
  {
    deallocate(w, aa[i]->name);
    deallocate(w, aa[i]->value.buf);
    deallocate(w, aa[i]);
  }

  for(i = 0; i < w->prefixes.count; i++)
    deallocate(w, pp[i]);

  deallocate(w, w->namespaces.pointers);
  deallocate(w, w->elements.pointers);
  deallocate(w, w->attributes.pointers);
  deallocate(w, w->prefixes.pointers);
  deallocate(w, w->stack.pointers);

  deallocate(w, w->arec.value.buf);

  deallocate(w, w->empty);

  /* how Oscar dealt with Igli */
  deallocate(w, w);
}